

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::handle_log_sync_resp(raft_server *this,resp_msg *resp)

{
  element_type *peVar1;
  ulong start_idx;
  int iVar2;
  element_type *peVar3;
  string local_40;
  
  peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*peVar1->_vptr_logger[7])();
      if (2 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_40,"got log sync resp while srv_to_join is null");
        (*peVar1->_vptr_logger[8])
                  (peVar1,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_log_sync_resp",0x162,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
      }
    }
  }
  else {
    if (peVar1 != (element_type *)0x0) {
      iVar2 = (*peVar1->_vptr_logger[7])();
      peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (4 < iVar2) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  (&local_40,"srv_to_join: %d\n",
                   (ulong)(uint)((peVar3->config_).
                                 super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)->id_);
        (*peVar1->_vptr_logger[8])
                  (peVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_log_sync_resp",0x15b,&local_40);
        std::__cxx11::string::~string((string *)&local_40);
        peVar3 = (this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
      }
    }
    LOCK();
    (peVar3->current_hb_interval_).super___atomic_base<int>._M_i = peVar3->hb_interval_;
    UNLOCK();
    start_idx = resp->next_idx_;
    LOCK();
    (((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    next_log_idx_).super___atomic_base<unsigned_long>._M_i = start_idx;
    UNLOCK();
    ((this->srv_to_join_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    matched_idx_ = start_idx - 1;
    sync_log_to_new_srv(this,start_idx);
  }
  return;
}

Assistant:

void raft_server::handle_log_sync_resp(resp_msg& resp) {
    if (srv_to_join_) {
        p_db("srv_to_join: %d\n", srv_to_join_->get_id());
        // we are reusing heartbeat interval value to indicate when to stop retry
        srv_to_join_->resume_hb_speed();
        srv_to_join_->set_next_log_idx(resp.get_next_idx());
        srv_to_join_->set_matched_idx(resp.get_next_idx() - 1);
        sync_log_to_new_srv(resp.get_next_idx());
    } else {
        p_wn("got log sync resp while srv_to_join is null");
    }
}